

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O3

void __thiscall
lr_grammar::GrammarLR::update_elem
          (GrammarLR *this,int elemIndex,int begin,int end,
          vector<int,_std::allocator<int>_> *factory)

{
  vector<int,std::allocator<int>> *pvVar1;
  pointer pEVar2;
  void *pvVar3;
  int iVar4;
  long *plVar5;
  int *piVar6;
  iterator iVar7;
  int iVar8;
  size_type *psVar9;
  long lVar10;
  ulong uVar11;
  pointer pEVar12;
  undefined4 in_register_00000014;
  ulong uVar13;
  Express *pEVar14;
  pointer piVar15;
  long lVar16;
  int newIndex;
  vector<int,_std::allocator<int>_> t;
  stringstream ss;
  int local_24c;
  vector<int,_std::allocator<int>_> local_248;
  undefined8 local_220;
  long local_218;
  int local_20c;
  string local_208;
  Express local_1e8;
  Express local_1d0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_220 = CONCAT44(in_register_00000014,begin);
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  pEVar12 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  std::__cxx11::stringbuf::str();
  plVar5 = (long *)std::__cxx11::string::replace
                             ((ulong)&local_248,0,(char *)0x0,
                              (ulong)pEVar12[elemIndex].super_Elem.name._M_dataplus._M_p);
  psVar9 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_208.field_2._M_allocated_capacity = *psVar9;
    local_208.field_2._8_8_ = plVar5[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar9;
    local_208._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_208._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  iVar4 = add_elem(this,&local_208,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p);
  }
  if ((pointer *)
      local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  pEVar12 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(int)local_220;
  lVar16 = *(long *)&pEVar12[elemIndex].expression_of_set.
                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                     ._M_impl.super__Vector_impl_data;
  local_218 = lVar10 * 3;
  uVar13 = *(long *)(lVar16 + 8 + lVar10 * 0x18) - *(long *)(lVar16 + lVar10 * 0x18);
  uVar11 = (long)(factory->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(factory->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_24c = iVar4;
  if (uVar13 == uVar11) {
    local_20c = -1;
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (&local_248,(iterator)0x0,&local_20c);
    pEVar12 = (this->elements).
              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    iVar8 = (int)(uVar11 >> 2);
    if ((ulong)(long)iVar8 < (ulong)((long)uVar13 >> 2)) {
      pEVar14 = (Express *)(lVar16 + lVar10 * 0x18);
      uVar11 = (ulong)iVar8;
      do {
        piVar6 = base_grammar::Express::operator[](pEVar14,(int)uVar11);
        if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&local_248,
                     (iterator)
                     local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,piVar6);
        }
        else {
          *local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = *piVar6;
          local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        uVar11 = uVar11 + 1;
        pEVar12 = (this->elements).
                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pEVar14 = (Express *)
                  (*(long *)&pEVar12[elemIndex].expression_of_set.
                             super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                             ._M_impl.super__Vector_impl_data + local_218 * 8);
      } while (uVar11 < (ulong)((long)(pEVar14->expression).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_finish -
                                (long)(pEVar14->expression).
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start >> 2));
    }
  }
  base_grammar::Express::Express(&local_1e8,&local_248);
  std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
            (&pEVar12[iVar4].expression_of_set,(value_type *)&local_1e8);
  if (local_1e8.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e8.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  iVar4 = (int)local_220 + 1;
  if (iVar4 < end) {
    lVar16 = (long)iVar4;
    do {
      if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
      }
      iVar4 = (int)((ulong)((long)(factory->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)(factory->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start) >> 2);
      pEVar12 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar10 = *(long *)&pEVar12[elemIndex].expression_of_set.
                         super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                         ._M_impl.super__Vector_impl_data;
      if ((ulong)(long)iVar4 <
          (ulong)(*(long *)(lVar10 + 8 + lVar16 * 0x18) - *(long *)(lVar10 + lVar16 * 0x18) >> 2)) {
        pEVar14 = (Express *)(lVar10 + lVar16 * 0x18);
        uVar11 = (ulong)iVar4;
        do {
          piVar6 = base_grammar::Express::operator[](pEVar14,(int)uVar11);
          if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_248,
                       (iterator)
                       local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,piVar6);
          }
          else {
            *local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish = *piVar6;
            local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
          uVar11 = uVar11 + 1;
          pEVar12 = (this->elements).
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pEVar14 = (Express *)
                    (*(long *)&pEVar12[elemIndex].expression_of_set.
                               super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                               ._M_impl.super__Vector_impl_data + lVar16 * 0x18);
        } while (uVar11 < (ulong)((long)(pEVar14->expression).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_finish -
                                  (long)(pEVar14->expression).
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start >> 2));
      }
      lVar10 = (long)local_24c;
      base_grammar::Express::Express(&local_1d0,&local_248);
      std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
                (&pEVar12[lVar10].expression_of_set,(value_type *)&local_1d0);
      if (local_1d0.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1d0.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      lVar16 = lVar16 + 1;
    } while ((int)lVar16 != end);
  }
  lVar10 = local_218;
  pEVar12 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  lVar16 = *(long *)&pEVar12[elemIndex].expression_of_set.
                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                     ._M_impl.super__Vector_impl_data;
  piVar6 = *(int **)(lVar16 + local_218 * 8);
  iVar7._M_current = *(int **)(lVar16 + 8 + local_218 * 8);
  if (iVar7._M_current != piVar6) {
    *(int **)(lVar16 + local_218 * 8 + 8) = piVar6;
    iVar7._M_current = piVar6;
  }
  piVar15 = (factory->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
            ._M_start;
  if ((factory->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar15) {
    lVar16 = 0;
    uVar11 = 0;
    do {
      pvVar1 = (vector<int,std::allocator<int>> *)
               (*(long *)&(this->elements).
                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                          ._M_impl.super__Vector_impl_data._M_start[elemIndex].expression_of_set.
                          super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                          ._M_impl.super__Vector_impl_data + lVar10 * 8);
      iVar7._M_current = *(int **)(pvVar1 + 8);
      if (iVar7._M_current == *(int **)(pvVar1 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar1,iVar7,(int *)((long)piVar15 + lVar16));
        piVar15 = (factory->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      else {
        *iVar7._M_current = *(int *)((long)piVar15 + lVar16);
        *(int **)(pvVar1 + 8) = iVar7._M_current + 1;
      }
      uVar11 = uVar11 + 1;
      lVar16 = lVar16 + 4;
    } while (uVar11 < (ulong)((long)(factory->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                    .super__Vector_impl_data._M_finish - (long)piVar15 >> 2));
    pEVar12 = (this->elements).
              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar16 = *(long *)&pEVar12[elemIndex].expression_of_set.
                       super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                       ._M_impl.super__Vector_impl_data;
    iVar7._M_current = *(int **)(lVar16 + 8 + lVar10 * 8);
  }
  pvVar1 = (vector<int,std::allocator<int>> *)(lVar16 + lVar10 * 8);
  if (iVar7._M_current == *(int **)(pvVar1 + 0x10)) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar1,iVar7,&local_24c);
    pEVar12 = (this->elements).
              super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
              _M_impl.super__Vector_impl_data._M_start;
    lVar16 = *(long *)&pEVar12[elemIndex].expression_of_set.
                       super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                       ._M_impl.super__Vector_impl_data;
  }
  else {
    *iVar7._M_current = local_24c;
    *(int **)(pvVar1 + 8) = iVar7._M_current + 1;
  }
  iVar4 = end - (int)local_220;
  uVar13 = (ulong)end;
  uVar11 = ((long)*(pointer *)
                   ((long)&pEVar12[elemIndex].expression_of_set.
                           super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                           ._M_impl + 8) - lVar16 >> 3) * -0x5555555555555555;
  if (uVar13 <= uVar11 && uVar11 - uVar13 != 0) {
    lVar10 = uVar13 * 0x18;
    do {
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)(lVar16 + lVar10) + (1 - (long)iVar4),
                 (vector<int,_std::allocator<int>_> *)(lVar16 + lVar10));
      uVar13 = uVar13 + 1;
      pEVar12 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      lVar16 = *(long *)&pEVar12[elemIndex].expression_of_set.
                         super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                         ._M_impl.super__Vector_impl_data;
      uVar11 = ((long)*(pointer *)
                       ((long)&pEVar12[elemIndex].expression_of_set.
                               super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                               ._M_impl + 8) - lVar16 >> 3) * -0x5555555555555555;
      lVar10 = lVar10 + 0x18;
    } while (uVar13 <= uVar11 && uVar11 - uVar13 != 0);
  }
  if (1 < iVar4) {
    iVar4 = ~(uint)local_220 + end;
    do {
      pEVar12 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pEVar2 = *(pointer *)
                ((long)&pEVar12[elemIndex].expression_of_set.
                        super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                        ._M_impl + 8);
      *(pointer *)
       ((long)&pEVar12[elemIndex].expression_of_set.
               super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>.
               _M_impl + 8) = pEVar2 + -1;
      pvVar3 = *(void **)&pEVar2[-1].super_Express.expression.
                          super__Vector_base<int,_std::allocator<int>_>;
      if (pvVar3 != (void *)0x0) {
        operator_delete(pvVar3);
      }
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  if (local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_248.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void GrammarLR::update_elem(int elemIndex, int begin, int end, vector<int>& factory){


    stringstream ss;
    ss << elements.size();
    int newIndex = add_elem(elements[elemIndex].name + ss.str(), false);

    //先对新的式子添加表达式,将begin到end添加的
    //产生空串的只有第一个begin有这个倾向，别的没有这个倾向,将begin单独拿出来作为特例
    vector<int> t;
    t.clear();
    if (elements[elemIndex].expression_of_set[begin].expression.size() == factory.size()){
        t.push_back(-1);
    }
    else
    {
        for (int i = factory.size(); i < elements[elemIndex].expression_of_set[begin].expression.size(); i++){
            t.push_back(elements[elemIndex].expression_of_set[begin][i]);
        }
    }
    elements[newIndex].add_expression(t);

    for (int i = begin + 1; i < end; i++){
        t.clear();
        for (int j = factory.size(); j < elements[elemIndex].expression_of_set[i].expression.size(); j++){
            t.push_back(elements[elemIndex].expression_of_set[i][j]);
        }
        elements[newIndex].add_expression(t);
    }


    //修改老元素了
    //1. 在begin下面放下结果
    elements[elemIndex].expression_of_set[begin].expression.clear();
    for (int i = 0; i < factory.size(); i++){
        elements[elemIndex].expression_of_set[begin].expression.push_back(factory[i]);
    }
    elements[elemIndex].expression_of_set[begin].expression.push_back(newIndex);

    //后面的元素提前
    int moveDistance = end - begin;
    for (int i = end; i < elements[elemIndex].expression_of_set.size(); i++){
        elements[elemIndex].expression_of_set[i - moveDistance + 1] = elements[elemIndex].expression_of_set[i];
    }

    //清楚元素，共清楚moveDistance-1个
    for (int i = 0; i < moveDistance - 1; i++){
        elements[elemIndex].expression_of_set.pop_back();
    }
}